

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.h
# Opt level: O3

bool CoreML::Specification::operator==(NonMaximumSuppression *a,NonMaximumSuppression *b)

{
  string *psVar1;
  string *psVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  
  if ((a->iouthreshold_ != b->iouthreshold_) || (NAN(a->iouthreshold_) || NAN(b->iouthreshold_))) {
    return false;
  }
  if ((a->confidencethreshold_ == b->confidencethreshold_) &&
     (!NAN(a->confidencethreshold_) && !NAN(b->confidencethreshold_))) {
    psVar1 = (a->confidenceinputfeaturename_).ptr_;
    psVar2 = (b->confidenceinputfeaturename_).ptr_;
    sVar3 = psVar1->_M_string_length;
    if ((sVar3 == psVar2->_M_string_length) &&
       ((sVar3 == 0 ||
        (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar5 == 0)))) {
      psVar1 = (a->coordinatesinputfeaturename_).ptr_;
      psVar2 = (b->coordinatesinputfeaturename_).ptr_;
      sVar3 = psVar1->_M_string_length;
      if ((sVar3 == psVar2->_M_string_length) &&
         ((sVar3 == 0 ||
          (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar5 == 0))))
      {
        psVar1 = (a->iouthresholdinputfeaturename_).ptr_;
        psVar2 = (b->iouthresholdinputfeaturename_).ptr_;
        sVar3 = psVar1->_M_string_length;
        if ((((sVar3 == psVar2->_M_string_length) &&
             ((((sVar3 == 0 ||
                (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3),
                iVar5 == 0)) &&
               (bVar4 = std::operator!=((a->confidencethresholdinputfeaturename_).ptr_,
                                        (b->confidencethresholdinputfeaturename_).ptr_), !bVar4)) &&
              ((bVar4 = std::operator!=((a->confidenceoutputfeaturename_).ptr_,
                                        (b->confidenceoutputfeaturename_).ptr_), !bVar4 &&
               (bVar4 = std::operator!=((a->coordinatesoutputfeaturename_).ptr_,
                                        (b->coordinatesoutputfeaturename_).ptr_), !bVar4)))))) &&
            (a->_oneof_case_[0] == b->_oneof_case_[0])) &&
           ((a->_oneof_case_[0] != 1 ||
            (((a->SuppressionMethod_).picktop_)->perclass_ ==
             ((b->SuppressionMethod_).picktop_)->perclass_)))) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

inline double NonMaximumSuppression::iouthreshold() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.NonMaximumSuppression.iouThreshold)
  return iouthreshold_;
}